

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::FMdivideMOD(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint Value;
  ulong uVar4;
  allocator<char> local_51;
  string local_50;
  
  requireDStackDepth(this,3,"FM/MOD");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"FM/MOD: zero divisor",&local_51);
    throwCppExceptionMessage(this,&local_50,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_50);
  }
  Value = (uint)(CONCAT44(uVar3,uVar2) / (long)(int)uVar1);
  uVar4 = CONCAT44(uVar3,uVar2) % (long)(int)uVar1;
  if ((((int)uVar1 < 0) && (0 < (long)uVar4)) || ((0 < (int)uVar1 && ((long)uVar4 < 0)))) {
    Value = Value - 1;
    uVar4 = (ulong)(uVar1 + (int)uVar4);
  }
  ForthStack<unsigned_int>::setTop(this_00,0,Value);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)uVar4);
  return;
}

Assistant:

void FMdivideMOD(){
			REQUIRE_DSTACK_DEPTH(3, "FM/MOD");
			SDCell n1{ static_cast<SCell>(dStack.getTop()) }; dStack.pop();
			SDCell d1(dStack.getTop(1),dStack.getTop());
			RUNTIME_ERROR_IF(n1.data_.Dcells == 0, "FM/MOD: zero divisor", errorDivisionByZero);
			SDCell quotent{ d1.data_.Dcells / n1.data_.Dcells }; // n3
			SDCell reminder{ d1.data_.Dcells % n1.data_.Dcells }; // n2
			if (((reminder.data_.Dcells > 0) && (n1.data_.Dcells < 0)) || 
				((reminder.data_.Dcells < 0) && (n1.data_.Dcells > 0))){
				reminder.data_.Dcells += n1.data_.Dcells;
				quotent.data_.Dcells--;
			}
			dStack.setTop(0, quotent.data_.Cells.lo);
			dStack.setTop(1, reminder.data_.Cells.lo);
		}